

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *p;
  double *pdVar1;
  double dVar2;
  short sVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ImVec2 IVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  bool bVar10;
  ImGuiWindow *potential_parent;
  undefined1 uVar11;
  uint uVar12;
  byte bVar13;
  ulong uVar14;
  int iVar15;
  byte bVar16;
  ulong uVar17;
  bool bVar18;
  byte bVar19;
  byte bVar20;
  ImGuiWindow *pIVar21;
  ImGuiWindow *pIVar22;
  float fVar23;
  float fVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  ImGuiWindow *local_80;
  ImRect local_78;
  undefined1 local_68 [16];
  ImVec2 local_58;
  undefined8 uStack_50;
  ImRect local_40;
  
  pIVar9 = GImGui;
  pIVar22 = GImGui->MovingWindow;
  pIVar21 = (ImGuiWindow *)0x0;
  if ((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x200) == 0)) {
    pIVar21 = pIVar22;
  }
  local_58 = (GImGui->Style).TouchExtraPadding;
  local_68._8_8_ = 0;
  local_68._0_4_ = local_58.x;
  local_68._4_4_ = local_58.y;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar24 = maxps(local_68,_DAT_00155f20);
    local_58 = auVar24._0_8_;
  }
  uStack_50 = 0;
  uVar14 = (ulong)(uint)(GImGui->Windows).Size;
  p = &(GImGui->IO).MousePos;
  local_80 = (ImGuiWindow *)0x0;
LAB_00113f14:
  uVar17 = uVar14 & 0xffffffff;
  auVar24 = local_68;
  do {
    uVar14 = uVar14 - 1;
    if ((int)uVar17 < 1) {
      pIVar9->HoveredWindow = pIVar21;
      if (pIVar21 != (ImGuiWindow *)0x0) goto LAB_0011409c;
      pIVar21 = (ImGuiWindow *)0x0;
      pIVar22 = (ImGuiWindow *)0x0;
      goto LAB_001140ab;
    }
    pIVar22 = (pIVar9->Windows).Data[uVar14];
    if (((pIVar22->Active == true) && (pIVar22->Hidden == false)) && ((pIVar22->Flags & 0x200) == 0)
       ) {
      IVar6 = (pIVar22->OuterRectClipped).Min;
      IVar7 = (pIVar22->OuterRectClipped).Max;
      uVar12 = (uint)((pIVar22->Flags & 0x1000042U) == 0);
      auVar25._0_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
      auVar25._4_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
      auVar25._8_8_ = 0;
      auVar8._8_8_ = uStack_50;
      auVar8._0_4_ = local_58.x;
      auVar8._4_4_ = local_58.y;
      auVar24 = ~auVar25 & auVar24 | auVar8 & auVar25;
      fVar23 = auVar24._0_4_;
      fVar26 = auVar24._4_4_;
      auVar4._4_8_ = SUB168(auVar8 & auVar25,8);
      auVar4._0_4_ = fVar26;
      auVar24._0_8_ = auVar4._0_8_ << 0x20;
      auVar24._8_4_ = fVar23;
      auVar24._12_4_ = fVar26;
      local_78.Min.x = IVar6.x;
      local_78.Min.y = IVar6.y;
      local_78.Max.x = IVar7.x;
      local_78.Max.y = IVar7.y;
      auVar5._4_8_ = auVar24._8_8_;
      auVar5._0_4_ = fVar26 + local_78.Min.y;
      auVar27._0_8_ = auVar5._0_8_ << 0x20;
      auVar27._8_4_ = fVar23 + local_78.Max.x;
      auVar27._12_4_ = fVar26 + local_78.Max.y;
      local_78.Min.x = local_78.Min.x - fVar23;
      local_78.Min.y = local_78.Min.y - fVar26;
      local_78.Max = auVar27._8_8_;
      bVar10 = ImRect::Contains(&local_78,p);
      if (!bVar10) goto LAB_00113f14;
      sVar3 = (pIVar22->HitTestHoleSize).x;
      if (sVar3 == 0) break;
      auVar24 = pshuflw(ZEXT416((uint)pIVar22->HitTestHoleOffset),
                        ZEXT416((uint)pIVar22->HitTestHoleOffset),0x60);
      local_40.Min.x = (float)(auVar24._0_4_ >> 0x10) + (pIVar22->Pos).x;
      local_40.Min.y = (float)(auVar24._4_4_ >> 0x10) + (pIVar22->Pos).y;
      local_40.Max.x = (float)(int)sVar3 + local_40.Min.x;
      local_40.Max.y =
           (float)(int)((long)((ulong)(ushort)(pIVar22->HitTestHoleSize).y << 0x30) >> 0x30) +
           local_40.Min.y;
      bVar10 = ImRect::Contains(&local_40,p);
      auVar24 = local_68;
      if (!bVar10) break;
    }
    uVar17 = (ulong)((int)uVar17 - 1);
  } while( true );
  if (pIVar21 == (ImGuiWindow *)0x0) {
    pIVar21 = pIVar22;
  }
  if (((local_80 == (ImGuiWindow *)0x0) &&
      (local_80 = pIVar22, pIVar9->MovingWindow != (ImGuiWindow *)0x0)) &&
     (pIVar22->RootWindow == pIVar9->MovingWindow->RootWindow)) {
    local_80 = (ImGuiWindow *)0x0;
  }
  else {
    if (pIVar21 != (ImGuiWindow *)0x0) {
      pIVar9->HoveredWindow = pIVar21;
LAB_0011409c:
      pIVar22 = pIVar21->RootWindow;
LAB_001140ab:
      pIVar9->HoveredRootWindow = pIVar22;
      pIVar9->HoveredWindowUnderMovingWindow = local_80;
      potential_parent = GetTopMostPopupModal();
      bVar10 = false;
      if ((potential_parent != (ImGuiWindow *)0x0) &&
         (bVar10 = false, pIVar22 != (ImGuiWindow *)0x0)) {
        bVar10 = IsWindowChildOf(pIVar22,potential_parent);
        bVar10 = !bVar10;
      }
      uVar12 = (pIVar9->IO).ConfigFlags;
      uVar14 = 0xffffffffffffffff;
      uVar17 = 0;
      bVar13 = 0;
      while( true ) {
        iVar15 = (int)uVar14;
        if (uVar17 == 5) break;
        if ((pIVar9->IO).MouseClicked[uVar17] == true) {
          bVar18 = true;
          if (pIVar21 == (ImGuiWindow *)0x0) {
            bVar18 = 0 < (pIVar9->OpenPopupStack).Size;
          }
          (pIVar9->IO).MouseDownOwned[uVar17] = bVar18;
        }
        bVar18 = (pIVar9->IO).MouseDown[uVar17];
        if ((bVar18 == true) &&
           ((iVar15 == -1 ||
            (dVar2 = (pIVar9->IO).MouseClickedTime[iVar15],
            pdVar1 = (pIVar9->IO).MouseClickedTime + uVar17, *pdVar1 <= dVar2 && dVar2 != *pdVar1)))
           ) {
          uVar14 = uVar17 & 0xffffffff;
        }
        bVar13 = bVar13 & 1 | bVar18;
        uVar17 = uVar17 + 1;
      }
      bVar20 = 1;
      bVar16 = 1;
      if (iVar15 != -1) {
        bVar16 = (pIVar9->IO).MouseDownOwned[iVar15];
      }
      bVar19 = (byte)((uVar12 & 0x10) >> 4) | bVar10;
      if (pIVar9->DragDropActive == true) {
        bVar20 = (pIVar9->DragDropSourceFlags & 0x10U) == 0 | bVar19;
      }
      if (bVar16 != 0) {
        bVar20 = bVar19;
      }
      if (bVar20 != 0) {
        pIVar9->HoveredWindow = (ImGuiWindow *)0x0;
        pIVar9->HoveredRootWindow = (ImGuiWindow *)0x0;
        pIVar9->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
        pIVar21 = (ImGuiWindow *)0x0;
      }
      if (pIVar9->WantCaptureMouseNextFrame == -1) {
        bVar10 = true;
        if ((bVar16 & (pIVar21 != (ImGuiWindow *)0x0 | bVar13)) == 0) {
          bVar10 = 0 < (pIVar9->OpenPopupStack).Size;
        }
        (pIVar9->IO).WantCaptureMouse = bVar10;
      }
      else {
        (pIVar9->IO).WantCaptureMouse = pIVar9->WantCaptureMouseNextFrame != 0;
      }
      if (pIVar9->WantCaptureKeyboardNextFrame == -1) {
        bVar10 = pIVar9->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0;
      }
      else {
        bVar10 = pIVar9->WantCaptureKeyboardNextFrame != 0;
      }
      uVar12 = uVar12 & 9;
      uVar11 = (char)uVar12;
      if (uVar12 != 1) {
        uVar11 = bVar10;
      }
      if ((pIVar9->IO).NavActive == false) {
        uVar11 = bVar10;
      }
      (pIVar9->IO).WantCaptureKeyboard = (bool)uVar11;
      (pIVar9->IO).WantTextInput = pIVar9->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
    pIVar21 = (ImGuiWindow *)0x0;
  }
  goto LAB_00113f14;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}